

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  Node *pNVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint newasize;
  int iVar7;
  uint a;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  Counters local_bc;
  
  if ((value->tt_ & 0xf) != 0) {
    iVar2 = insertkey(t,key,value);
    if (iVar2 == 0) {
      for (lVar3 = 3; lVar3 != 0x23; lVar3 = lVar3 + 1) {
        local_bc.nums[lVar3 + -3] = 0;
      }
      local_bc.deleted = 0;
      local_bc.total = 1;
      local_bc.na = 0;
      if (key->tt_ == '\x03') {
        countint((key->value_).i,&local_bc);
      }
      lVar3 = 1L << (t->lsizenode & 0x3f);
      iVar2 = 0;
LAB_001195c6:
LAB_001195cb:
      lVar13 = -lVar3;
      lVar3 = lVar3 * 0x18 + 0x10;
      iVar12 = local_bc.deleted;
LAB_001195da:
      local_bc.deleted = iVar12;
      lVar4 = lVar3;
      lVar13 = lVar13 + 1;
      if (lVar13 != 1) goto code_r0x001195e5;
      iVar2 = iVar2 + local_bc.total;
      newasize = t->asize;
      if (local_bc.na == 0) {
        iVar12 = 0;
      }
      else {
        lVar3 = 0;
        uVar6 = 1;
        iVar7 = 0;
        uVar8 = 1;
        while ((lVar3 != 0x20 &&
               ((uVar10 = uVar6, uVar6 <= newasize || (uVar10 = newasize, uVar8 <= newasize))))) {
          uVar11 = uVar10 + 1;
          if (uVar10 + 1 < uVar8) {
            uVar11 = uVar8;
          }
          iVar12 = 0;
          for (uVar8 = uVar8 - 1; uVar8 - uVar11 != -1; uVar8 = uVar8 + 1) {
            iVar12 = (iVar12 + 1) -
                     (uint)((*(byte *)((long)t->array + (ulong)uVar8 + 4) & 0xf) == 0);
          }
          local_bc.nums[lVar3] = local_bc.nums[lVar3] + iVar12;
          iVar7 = iVar7 + iVar12;
          lVar3 = lVar3 + 1;
          uVar6 = uVar6 * 2;
          uVar8 = uVar11;
        }
        iVar2 = iVar2 + iVar7;
        lVar3 = 0;
        uVar9 = 0;
        uVar5 = 0;
        newasize = 0;
        for (uVar6 = 1;
            (iVar12 = (int)uVar5, lVar3 != 0x20 &&
            ((ulong)uVar6 <= (ulong)(local_bc.na + iVar7) * 3)); uVar6 = uVar6 * 2) {
          uVar9 = (ulong)((int)uVar9 + local_bc.nums[lVar3]);
          if ((ulong)uVar6 <= uVar9 * 3 && local_bc.nums[lVar3] != 0) {
            newasize = uVar6;
            uVar5 = uVar9;
          }
          lVar3 = lVar3 + 1;
        }
      }
      uVar6 = (uint)(iVar2 - iVar12) >> 2;
      if (local_bc.deleted == 0) {
        uVar6 = 0;
      }
      luaH_resize(L,t,newasize,uVar6 + (iVar2 - iVar12));
      newcheckedkey(t,key,value);
    }
    if ((((key->tt_ & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
       ((((key->value_).gc)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(GCObject *)t);
      return;
    }
  }
  return;
code_r0x001195e5:
  pNVar1 = t->node;
  lVar3 = lVar4 + -0x18;
  iVar12 = 1;
  if ((*(byte *)((long)pNVar1 + lVar4 + -0x20) & 0xf) != 0) goto code_r0x001195fb;
  goto LAB_001195da;
code_r0x001195fb:
  iVar2 = iVar2 + 1;
  lVar3 = -lVar13;
  if (*(char *)((long)pNVar1 + lVar4 + -0x1f) == '\x03') goto code_r0x0011960c;
  goto LAB_001195cb;
code_r0x0011960c:
  countint(*(lua_Integer *)((long)pNVar1 + lVar4 + -0x18),&local_bc);
  goto LAB_001195c6;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  if (!ttisnil(value)) {  /* do not insert nil values */
    int done = insertkey(t, key, value);
    if (!done) {  /* could not find a free place? */
      rehash(L, t, key);  /* grow table */
      newcheckedkey(t, key, value);  /* insert key in grown table */
    }
    luaC_barrierback(L, obj2gco(t), key);
    /* for debugging only: any new key may force an emergency collection */
    condchangemem(L, (void)0, (void)0, 1);
  }
}